

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

Map<int,_float> * __thiscall
google::protobuf::internal::TypeDefinedMapFieldBase<int,_float>::MutableMap
          (TypeDefinedMapFieldBase<int,_float> *this)

{
  TypeDefinedMapFieldBase<int,_float> *this_local;
  
  MapFieldBase::SyncMapWithRepeatedField(&this->super_MapFieldBase);
  MapFieldBase::SetMapDirty(&this->super_MapFieldBase);
  return (Map<int,_float> *)&this->field_0;
}

Assistant:

Map<Key, T>* MutableMap() {
    SyncMapWithRepeatedField();
    SetMapDirty();
    return &map_;
  }